

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathway.c
# Opt level: O2

int equal_pathway(pathway_t *a,pathway_t *b)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = strcmp(a->id,b->id);
  uVar2 = 0;
  uVar3 = 0;
  if (iVar1 == 0) {
    iVar1 = strcmp(a->from_stop_id,b->from_stop_id);
    uVar3 = uVar2;
    if (iVar1 == 0) {
      iVar1 = strcmp(a->to_stop_id,b->to_stop_id);
      if (iVar1 == 0) {
        iVar1 = strcmp(a->signposted_as,b->signposted_as);
        if (iVar1 == 0) {
          iVar1 = strcmp(a->reversed_signposted_as,b->reversed_signposted_as);
          if ((((((iVar1 == 0) && (a->mode == b->mode)) &&
                (a->is_bidirectional == b->is_bidirectional)) &&
               ((a->length == b->length && (!NAN(a->length) && !NAN(b->length))))) &&
              ((a->traversal_time == b->traversal_time &&
               ((a->stair_count == b->stair_count && (a->max_slope == b->max_slope)))))) &&
             (!NAN(a->max_slope) && !NAN(b->max_slope))) {
            uVar3 = -(uint)(b->min_width == a->min_width) & 1;
          }
        }
      }
    }
  }
  return uVar3;
}

Assistant:

int equal_pathway(const pathway_t *a, const pathway_t *b) {
    return (!strcmp(a->id, b->id) &&
             !strcmp(a->from_stop_id, b->from_stop_id) &&
             !strcmp(a->to_stop_id, b->to_stop_id) &&
             !strcmp(a->signposted_as, b->signposted_as) &&
             !strcmp(a->reversed_signposted_as, b->reversed_signposted_as) &&
             a->mode == b->mode &&
             a->is_bidirectional == b->is_bidirectional &&
             a->length == b->length &&
             a->traversal_time == b->traversal_time &&
             a->stair_count == b->stair_count &&
             a->max_slope == b->max_slope &&
             a->min_width == b->min_width);
}